

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateSiblings
          (FileGenerator *this,string *package_dir,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  undefined4 extraout_var;
  FileDescriptor *pFVar5;
  undefined4 extraout_var_00;
  pointer pbVar6;
  size_type *psVar7;
  EnumDescriptor *pEVar8;
  long lVar9;
  long lVar10;
  string filename;
  Printer printer;
  string filename_1;
  undefined1 local_100 [16];
  Descriptor *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  value_type local_d8;
  undefined1 local_b8 [24];
  long lStack_a0;
  string *local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  ZeroCopyOutputStream *pZVar4;
  
  pFVar5 = this->file_;
  if (*(char *)(*(long *)(pFVar5 + 0x88) + 0x54) == '\x01') {
    local_f0 = (Descriptor *)context;
    local_e8 = file_list;
    local_e0 = package_dir;
    if (0 < *(int *)(pFVar5 + 0x58)) {
      local_70 = &this->java_package_;
      lVar10 = 0;
      lVar9 = 0;
      do {
        lVar1 = *(long *)(pFVar5 + 0x60);
        local_100[0] = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,local_e0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + lVar10));
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_68,(ulong)local_100);
        pbVar6 = (pointer)(plVar3 + 2);
        if ((pointer)*plVar3 == pbVar6) {
          local_b8._16_8_ = (pbVar6->_M_dataplus)._M_p;
          lStack_a0 = plVar3[3];
          local_b8._0_8_ = (pointer)(local_b8 + 0x10);
        }
        else {
          local_b8._16_8_ = (pbVar6->_M_dataplus)._M_p;
          local_b8._0_8_ = (pointer)*plVar3;
        }
        local_b8._8_8_ = plVar3[1];
        *plVar3 = (long)pbVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)local_b8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        psVar7 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_d8.field_2._M_allocated_capacity = *psVar7;
          local_d8.field_2._8_8_ = plVar3[3];
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar7;
          local_d8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_d8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_b8._16_8_)->_M_p + 1));
        }
        if ((EnumDescriptor *)local_68._0_8_ != (EnumDescriptor *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,local_58[0]._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_e8,&local_d8);
        iVar2 = (*(*(_func_int ***)local_f0)[2])(local_f0,&local_d8);
        pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
        io::Printer::Printer((Printer *)local_b8,pZVar4,'$');
        io::Printer::Print((Printer *)local_b8,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar1 + 0x10 + lVar10));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print((Printer *)local_b8,"package $package$;\n\n","package",local_70);
        }
        EnumGenerator::EnumGenerator((EnumGenerator *)local_68,(EnumDescriptor *)(lVar1 + lVar10));
        EnumGenerator::Generate((EnumGenerator *)local_68,(Printer *)local_b8);
        EnumGenerator::~EnumGenerator((EnumGenerator *)local_68);
        io::Printer::~Printer((Printer *)local_b8);
        if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar4->_vptr_ZeroCopyOutputStream[1])(pZVar4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        lVar9 = lVar9 + 1;
        pFVar5 = this->file_;
        lVar10 = lVar10 + 0x38;
      } while (lVar9 < *(int *)(pFVar5 + 0x58));
    }
    pFVar5 = this->file_;
    if (0 < *(int *)(pFVar5 + 0x48)) {
      pbVar6 = (pointer)(local_b8 + 0x10);
      lVar9 = 0;
      lVar10 = 0;
      do {
        local_b8._16_8_ = (pointer)0x65646c697542724f;
        local_b8._8_8_ = (pointer)0x9;
        lStack_a0 = CONCAT62(lStack_a0._2_6_,0x72);
        local_68._0_8_ = MessageGenerator::GenerateInterface;
        local_68._8_8_ = (pointer)0x0;
        local_b8._0_8_ = pbVar6;
        GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                  ((java *)local_e0,&this->java_package_,
                   (string *)(*(long *)(pFVar5 + 0x50) + lVar9),local_f0,
                   (GeneratorContext *)local_e8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8,(string *)MessageGenerator::GenerateInterface,0);
        if ((pointer)local_b8._0_8_ != pbVar6) {
          operator_delete((void *)local_b8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_b8._16_8_)->_M_p + 1));
        }
        local_b8._8_8_ = (pointer)0x0;
        local_b8._16_8_ = local_b8._16_8_ & 0xffffffffffffff00;
        local_68._0_8_ = MessageGenerator::Generate;
        local_68._8_8_ = (pointer)0x0;
        local_b8._0_8_ = pbVar6;
        GenerateSibling<google::protobuf::compiler::java::MessageGenerator,google::protobuf::Descriptor>
                  ((java *)local_e0,&this->java_package_,
                   (string *)(*(long *)(this->file_ + 0x50) + lVar9),local_f0,
                   (GeneratorContext *)local_e8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8,(string *)MessageGenerator::Generate,0);
        if ((pointer)local_b8._0_8_ != pbVar6) {
          operator_delete((void *)local_b8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_b8._16_8_)->_M_p + 1));
        }
        lVar10 = lVar10 + 1;
        pFVar5 = this->file_;
        lVar9 = lVar9 + 0x78;
      } while (lVar10 < *(int *)(pFVar5 + 0x48));
    }
    if ((((0 < *(int *)(pFVar5 + 0x68)) && (*(int *)(*(long *)(pFVar5 + 0x88) + 0x50) != 3)) &&
        (*(char *)(*(long *)(pFVar5 + 0x88) + 0x57) == '\x01')) &&
       (pFVar5 = this->file_, 0 < *(int *)(pFVar5 + 0x68))) {
      local_70 = &this->java_package_;
      lVar10 = 0;
      lVar9 = 0;
      do {
        lVar1 = *(long *)(pFVar5 + 0x70);
        local_100[0] = 0;
        std::operator+(&local_d8,local_e0,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (lVar1 + lVar10));
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_100);
        pbVar6 = (pointer)(plVar3 + 2);
        if ((pointer)*plVar3 == pbVar6) {
          local_b8._16_8_ = (pbVar6->_M_dataplus)._M_p;
          lStack_a0 = plVar3[3];
          local_b8._0_8_ = (pointer)(local_b8 + 0x10);
        }
        else {
          local_b8._16_8_ = (pbVar6->_M_dataplus)._M_p;
          local_b8._0_8_ = (pointer)*plVar3;
        }
        local_b8._8_8_ = plVar3[1];
        *plVar3 = (long)pbVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)local_b8);
        local_68._0_8_ = local_68 + 0x10;
        pEVar8 = (EnumDescriptor *)(plVar3 + 2);
        if ((EnumDescriptor *)*plVar3 == pEVar8) {
          local_58[0]._0_8_ = *(undefined8 *)pEVar8;
          local_58[0]._8_8_ = plVar3[3];
        }
        else {
          local_58[0]._0_8_ = *(undefined8 *)pEVar8;
          local_68._0_8_ = (EnumDescriptor *)*plVar3;
        }
        local_68._8_8_ = plVar3[1];
        *plVar3 = (long)pEVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
          operator_delete((void *)local_b8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_b8._16_8_)->_M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_e8,(value_type *)local_68);
        iVar2 = (*(*(_func_int ***)local_f0)[2])(local_f0,(value_type *)local_68);
        pZVar4 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar2);
        io::Printer::Printer((Printer *)local_b8,pZVar4,'$');
        io::Printer::Print((Printer *)local_b8,
                           "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
                           ,"filename",(string *)**(undefined8 **)(lVar1 + 0x10 + lVar10));
        if ((this->java_package_)._M_string_length != 0) {
          io::Printer::Print((Printer *)local_b8,"package $package$;\n\n","package",local_70);
        }
        ServiceGenerator::ServiceGenerator
                  ((ServiceGenerator *)&local_d8,(ServiceDescriptor *)(lVar1 + lVar10));
        ServiceGenerator::Generate((ServiceGenerator *)&local_d8,(Printer *)local_b8);
        ServiceGenerator::~ServiceGenerator((ServiceGenerator *)&local_d8);
        io::Printer::~Printer((Printer *)local_b8);
        if (pZVar4 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar4->_vptr_ZeroCopyOutputStream[1])(pZVar4);
        }
        if ((EnumDescriptor *)local_68._0_8_ != (EnumDescriptor *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,local_58[0]._M_allocated_capacity + 1);
        }
        lVar9 = lVar9 + 1;
        pFVar5 = this->file_;
        lVar10 = lVar10 + 0x30;
      } while (lVar9 < *(int *)(pFVar5 + 0x68));
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateSiblings(const string& package_dir,
                                     GeneratorContext* context,
                                     vector<string>* file_list) {
  if (file_->options().java_multiple_files()) {
    for (int i = 0; i < file_->enum_type_count(); i++) {
      GenerateSibling<EnumGenerator>(package_dir, java_package_,
                                     file_->enum_type(i),
                                     context, file_list, "",
                                     &EnumGenerator::Generate);
    }
    for (int i = 0; i < file_->message_type_count(); i++) {
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        context, file_list, "OrBuilder",
                                        &MessageGenerator::GenerateInterface);
      GenerateSibling<MessageGenerator>(package_dir, java_package_,
                                        file_->message_type(i),
                                        context, file_list, "",
                                        &MessageGenerator::Generate);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        GenerateSibling<ServiceGenerator>(package_dir, java_package_,
                                          file_->service(i),
                                          context, file_list, "",
                                          &ServiceGenerator::Generate);
      }
    }
  }
}